

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O1

bool __thiscall
S2Builder::Graph::GetLeftTurnMap
          (Graph *this,vector<int,_std::allocator<int>_> *in_edge_ids,
          vector<int,_std::allocator<int>_> *left_turn_map,S2Error *error)

{
  int iVar1;
  VertexId VVar2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar3;
  pointer ppVar4;
  pointer piVar5;
  pointer pVVar6;
  undefined4 uVar7;
  long lVar8;
  VertexEdge *pVVar9;
  ulong uVar10;
  pointer ppVar11;
  undefined8 uVar12;
  int *piVar13;
  int *piVar14;
  EdgeId *__args;
  int *piVar15;
  int iVar16;
  __normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_> __i;
  long lVar17;
  __normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_> _Var18;
  int iVar19;
  EdgeId *pEVar20;
  iterator __position;
  vector<int,std::allocator<int>> *this_00;
  uint uVar21;
  VertexEdge *pVVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  bool bVar26;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:271:15)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:271:15)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:271:15)>
  __comp_01;
  vector<VertexEdge,_std::allocator<VertexEdge>_> v0_edges;
  Edge sentinel;
  vector<int,_std::allocator<int>_> e_in;
  vector<int,_std::allocator<int>_> e_out;
  VertexEdge local_f0;
  ulong local_e0;
  int local_d4;
  __normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_> local_d0;
  vector<VertexEdge,_std::allocator<VertexEdge>_> local_c8;
  undefined1 local_a8 [16];
  int *local_98;
  int *piStack_90;
  int *local_88;
  ulong local_80;
  int *local_78;
  int *piStack_70;
  int *local_68;
  VertexEdge *local_60;
  S2Error *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  VertexEdge *local_48;
  Graph *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
  local_58 = error;
  local_50 = left_turn_map;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (left_turn_map,
             (long)(int)((ulong)((long)(this->edges_->
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->edges_->
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3),
             (value_type_conflict2 *)&local_c8);
  pvVar3 = this->edges_;
  if ((int)((ulong)((long)(pvVar3->
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar3->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 3) == 0) {
    bVar26 = true;
  }
  else {
    local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
    super__Vector_impl_data._M_start = (VertexEdge *)0x0;
    local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
    super__Vector_impl_data._M_finish = (VertexEdge *)0x0;
    local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (VertexEdge *)0x0;
    local_88 = (int *)0x0;
    local_98 = (int *)0x0;
    piStack_90 = (int *)0x0;
    local_68 = (int *)0x0;
    local_78 = (int *)0x0;
    piStack_70 = (int *)0x0;
    pVVar22 = (VertexEdge *)
              (pvVar3->
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)*(in_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    local_a8._0_4_ = this->num_vertices_;
    local_a8._4_4_ = local_a8._0_4_;
    iVar24 = (&pVVar22->index)[lVar8 * 2];
    local_f0.incoming = (bool)(char)iVar24;
    local_f0._1_3_ = (int3)((uint)iVar24 >> 8);
    local_f0.index = *(int *)(&pVVar22->incoming + lVar8 * 8);
    if (iVar24 < (int)*(uint *)pVVar22) {
      pVVar9 = &local_f0;
    }
    else {
      pVVar9 = pVVar22;
      if ((iVar24 <= (int)*(uint *)pVVar22) &&
         (pVVar9 = &local_f0, pVVar22->index <= *(int *)(&pVVar22->incoming + lVar8 * 8))) {
        pVVar9 = pVVar22;
      }
    }
    local_80._0_1_ = pVVar9->incoming;
    local_80._1_3_ = *(undefined3 *)&pVVar9->field_0x1;
    local_80._4_4_ = pVVar9->index;
    local_e0 = local_80 >> 0x20;
    if ((local_a8._0_4_ != (int)local_80) || (local_a8._0_4_ != local_80._4_4_)) {
      local_60 = (VertexEdge *)(&pVVar22->incoming + lVar8 * 8);
      local_d4 = 0;
      iVar24 = 0;
      local_38 = in_edge_ids;
      local_40 = this;
      do {
        local_a8._8_4_ = (int)local_80;
        uVar10 = local_80;
        iVar23 = iVar24;
        do {
          iVar19 = local_d4;
          uVar21 = (uint)uVar10;
          if ((*(uint *)pVVar22 == uVar21) && (pVVar22->index == (uint)local_e0)) {
            ppVar4 = (this->edges_->
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar11 = ppVar4 + local_d4;
            do {
              ppVar11 = ppVar11 + 1;
              pVVar22 = (VertexEdge *)ppVar11;
              if ((int)((ulong)((long)(this->edges_->
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4) >>
                       3) + -1 == local_d4) {
                pVVar22 = (VertexEdge *)local_a8;
              }
              local_d4 = local_d4 + 1;
            } while ((*(uint *)pVVar22 == uVar21) && (pVVar22->index == (uint)local_e0));
          }
          local_d0._M_current._0_4_ = iVar23;
          iVar24 = iVar23;
          if ((local_60->index == uVar21) && (*(uint *)local_60 == (uint)local_e0)) {
            ppVar11 = (this->edges_->
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            piVar14 = (in_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start + iVar23;
            do {
              piVar14 = piVar14 + 1;
              local_60 = (VertexEdge *)local_a8;
              if ((int)((ulong)((long)(this->edges_->
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar11)
                       >> 3) + -1 != iVar24) {
                local_60 = (VertexEdge *)(ppVar11 + *piVar14);
              }
              iVar24 = iVar24 + 1;
            } while ((local_60->index == uVar21) && (*(uint *)local_60 == (uint)local_e0));
          }
          if (local_a8._8_4_ == (uint)local_e0) {
            if (iVar23 < iVar24) {
              piVar5 = (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              lVar8 = 0;
              do {
                piVar5[iVar23 + lVar8] = iVar23 + (int)lVar8;
                lVar8 = lVar8 + 1;
              } while ((long)iVar24 - (long)iVar23 != lVar8);
            }
          }
          else {
            iVar16 = 0;
            local_80 = CONCAT44(local_80._4_4_,local_d4 - iVar19);
            iVar25 = iVar24;
            if (local_d4 - iVar19 < iVar24 - iVar23) {
              iVar23 = -iVar23;
              iVar16 = 0;
              iVar25 = -1;
              do {
                local_f0.incoming = true;
                local_f0.index = iVar24 + iVar25;
                uVar12 = local_f0._0_8_;
                local_f0.endpoint = (VertexId)local_e0;
                local_f0.rank = iVar16;
                if (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<VertexEdge,_std::allocator<VertexEdge>_>::
                  _M_realloc_insert<VertexEdge>
                            (&local_c8,
                             (iterator)
                             local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>.
                             _M_impl.super__Vector_impl_data._M_finish,&local_f0);
                }
                else {
                  (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish)->incoming = local_f0.incoming;
                  *(undefined3 *)
                   &(local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                     super__Vector_impl_data._M_finish)->field_0x1 = local_f0._1_3_;
                  (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish)->index = iVar24 + iVar25;
                  (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish)->endpoint = (VertexId)local_e0;
                  (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish)->rank = iVar16;
                  local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                  local_f0._0_8_ = uVar12;
                }
                iVar1 = iVar24 + iVar23;
                iVar23 = iVar23 + -1;
                iVar25 = iVar25 + -1;
                iVar16 = iVar16 + 1;
              } while ((int)local_80 < iVar1 + -1);
              iVar25 = iVar24 - iVar16;
              iVar23 = (int)local_d0._M_current;
            }
            if (iVar23 < iVar25) {
              do {
                iVar23 = iVar16;
                local_f0._0_8_ = CONCAT44(iVar19,local_f0._0_4_) & 0xffffffffffffff00;
                local_f0.endpoint = (VertexId)local_e0;
                if (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  local_f0.rank = iVar23;
                  std::vector<VertexEdge,_std::allocator<VertexEdge>_>::
                  _M_realloc_insert<VertexEdge>
                            (&local_c8,
                             (iterator)
                             local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>.
                             _M_impl.super__Vector_impl_data._M_finish,&local_f0);
                }
                else {
                  (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish)->incoming = local_f0.incoming;
                  *(undefined3 *)
                   &(local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                     super__Vector_impl_data._M_finish)->field_0x1 = local_f0._1_3_;
                  (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish)->index = local_f0.index;
                  (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish)->endpoint = local_f0.endpoint;
                  (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish)->rank = iVar23;
                  local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                iVar25 = iVar25 + -1;
                local_f0.incoming = true;
                local_f0.index = iVar25;
                uVar12 = local_f0._0_8_;
                local_f0.endpoint = (VertexId)local_e0;
                local_f0.rank = iVar23 + 1;
                if (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<VertexEdge,_std::allocator<VertexEdge>_>::
                  _M_realloc_insert<VertexEdge>
                            (&local_c8,
                             (iterator)
                             local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>.
                             _M_impl.super__Vector_impl_data._M_finish,&local_f0);
                }
                else {
                  (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish)->incoming = local_f0.incoming;
                  *(undefined3 *)
                   &(local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                     super__Vector_impl_data._M_finish)->field_0x1 = local_f0._1_3_;
                  (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish)->index = iVar25;
                  (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish)->endpoint = (VertexId)local_e0;
                  (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish)->rank = iVar23 + 1;
                  local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                  local_f0._0_8_ = uVar12;
                }
                iVar19 = iVar19 + 1;
                iVar16 = iVar23 + 2;
              } while ((int)local_d0._M_current < iVar25);
              iVar16 = iVar23 + 2;
            }
            in_edge_ids = local_38;
            this = local_40;
            if (iVar19 < local_d4) {
              do {
                local_f0._0_8_ = CONCAT44(iVar19,local_f0._0_4_) & 0xffffffffffffff00;
                local_f0.endpoint = (VertexId)local_e0;
                local_f0.rank = iVar16;
                if (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<VertexEdge,_std::allocator<VertexEdge>_>::
                  _M_realloc_insert<VertexEdge>
                            (&local_c8,
                             (iterator)
                             local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>.
                             _M_impl.super__Vector_impl_data._M_finish,&local_f0);
                }
                else {
                  (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish)->incoming = local_f0.incoming;
                  *(undefined3 *)
                   &(local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                     super__Vector_impl_data._M_finish)->field_0x1 = local_f0._1_3_;
                  (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish)->index = local_f0.index;
                  (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish)->endpoint = (VertexId)local_e0;
                  (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish)->rank = iVar16;
                  local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                iVar19 = iVar19 + 1;
                iVar16 = iVar16 + 1;
              } while (local_d4 != iVar19);
            }
          }
          iVar23 = local_60->index;
          local_f0.incoming = (bool)(char)iVar23;
          local_f0._1_3_ = (int3)((uint)iVar23 >> 8);
          local_f0.index = *(uint *)local_60;
          pVVar9 = &local_f0;
          if ((((int)*(uint *)pVVar22 <= iVar23) &&
              (pVVar9 = pVVar22, iVar23 <= (int)*(uint *)pVVar22)) &&
             ((int)*(uint *)local_60 < pVVar22->index)) {
            pVVar9 = &local_f0;
          }
          uVar10 = (ulong)*(uint *)pVVar9;
          local_e0 = (ulong)(uint)pVVar9->index;
          uVar7 = local_a8._8_4_;
          iVar23 = iVar24;
        } while (*(uint *)pVVar9 == local_a8._8_4_);
        local_80 = uVar10;
        if (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          _Var18._M_current =
               local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
          local_d0._M_current =
               local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (_Var18._M_current !=
              local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            VVar2 = (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                     super__Vector_impl_data._M_start)->endpoint;
            uVar12 = CONCAT44(VVar2,local_a8._8_4_);
            lVar17 = (long)local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)_Var18._M_current;
            uVar10 = lVar17 >> 4;
            lVar8 = 0x3f;
            if (uVar10 != 0) {
              for (; uVar10 >> lVar8 == 0; lVar8 = lVar8 + -1) {
              }
            }
            local_48 = local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_a8._8_8_ = _Var18._M_current;
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<VertexEdge*,std::vector<VertexEdge,std::allocator<VertexEdge>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::GetLeftTurnMap(std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>*,S2Error*)const::__0>>
                      (_Var18,(__normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_>
                               )local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                       (ulong)(((uint)lVar8 ^ 0x3f) * 2) ^ 0x7e,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:271:15)>
                        )CONCAT88(this,uVar12));
            if (lVar17 < 0x101) {
              __comp_01._M_comp.this = this;
              __comp_01._M_comp.v0 = uVar7;
              __comp_01._M_comp.min_endpoint = VVar2;
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<VertexEdge*,std::vector<VertexEdge,std::allocator<VertexEdge>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::GetLeftTurnMap(std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>*,S2Error*)const::__0>>
                        ((__normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_>
                          )local_a8._8_8_,local_d0,__comp_01);
            }
            else {
              _Var18._M_current = local_48 + 0x11;
              __comp_00._M_comp.this = this;
              __comp_00._M_comp.v0 = uVar7;
              __comp_00._M_comp.min_endpoint = VVar2;
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<VertexEdge*,std::vector<VertexEdge,std::allocator<VertexEdge>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::GetLeftTurnMap(std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>*,S2Error*)const::__0>>
                        ((__normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_>
                          )local_a8._8_8_,_Var18,__comp_00);
              for (; _Var18._M_current != local_d0._M_current;
                  _Var18._M_current = _Var18._M_current + 1) {
                __comp._M_comp.this = this;
                __comp._M_comp.v0 = uVar7;
                __comp._M_comp.min_endpoint = VVar2;
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<VertexEdge*,std::vector<VertexEdge,std::allocator<VertexEdge>>>,__gnu_cxx::__ops::_Val_comp_iter<S2Builder::Graph::GetLeftTurnMap(std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>*,S2Error*)const::__0>>
                          (_Var18,__comp);
              }
            }
          }
          pVVar6 = local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pEVar20 = &(local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl
                        .super__Vector_impl_data._M_start)->index;
            do {
              if (((VertexEdge *)(pEVar20 + -1))->incoming == true) {
                __args = (in_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + *pEVar20;
                if (piStack_90 == local_88) {
                  this_00 = (vector<int,std::allocator<int>> *)&local_98;
                  __position._M_current = piStack_90;
LAB_001c2b97:
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (this_00,__position,__args);
                }
                else {
                  *piStack_90 = *__args;
                  piStack_90 = piStack_90 + 1;
                }
              }
              else if (local_98 == piStack_90) {
                if (piStack_70 == local_68) {
                  this_00 = (vector<int,std::allocator<int>> *)&local_78;
                  __args = pEVar20;
                  __position._M_current = piStack_70;
                  goto LAB_001c2b97;
                }
                *piStack_70 = *pEVar20;
                piStack_70 = piStack_70 + 1;
              }
              else {
                (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[piStack_90[-1]] = *pEVar20;
                piStack_90 = piStack_90 + -1;
              }
              pVVar9 = (VertexEdge *)(pEVar20 + 3);
              pEVar20 = pEVar20 + 4;
            } while (pVVar9 != pVVar6);
          }
          piVar13 = piStack_70 + -1;
          piVar14 = local_78;
          if (local_78 < piVar13 && local_78 != piStack_70) {
            do {
              piVar15 = piVar14 + 1;
              iVar23 = *piVar14;
              *piVar14 = *piVar13;
              *piVar13 = iVar23;
              piVar13 = piVar13 + -1;
              piVar14 = piVar15;
            } while (piVar15 < piVar13);
          }
          while (local_78 != piStack_70) {
            piVar14 = piStack_70 + -1;
            if (piStack_90 == local_98) break;
            (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[piStack_90[-1]] = *piVar14;
            piStack_70 = piVar14;
            piStack_90 = piStack_90 + -1;
          }
          if ((local_98 != piStack_90) && (local_58->code_ == OK)) {
            S2Error::Init(local_58,BUILDER_EDGES_DO_NOT_FORM_LOOPS,
                          "Given edges do not form loops (indegree != outdegree)");
          }
          if (piStack_90 != local_98) {
            piStack_90 = local_98;
          }
          if (piStack_70 != local_78) {
            piStack_70 = local_78;
          }
          if (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
        }
      } while (((int)local_80 != local_a8._0_4_) || ((int)local_e0 != local_a8._4_4_));
    }
    bVar26 = local_58->code_ == OK;
    if (local_78 != (int *)0x0) {
      operator_delete(local_78);
    }
    if (local_98 != (int *)0x0) {
      operator_delete(local_98);
    }
    if (local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
        super__Vector_impl_data._M_start != (VertexEdge *)0x0) {
      operator_delete(local_c8.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return bVar26;
}

Assistant:

bool Graph::GetLeftTurnMap(const vector<EdgeId>& in_edge_ids,
                           vector<EdgeId>* left_turn_map,
                           S2Error* error) const {
  left_turn_map->assign(num_edges(), -1);
  if (num_edges() == 0) return true;

  // Declare vectors outside the loop to avoid reallocating them each time.
  vector<VertexEdge> v0_edges;
  vector<EdgeId> e_in, e_out;

  // Walk through the two sorted arrays of edges (outgoing and incoming) and
  // gather all the edges incident to each vertex.  Then we sort those edges
  // and add an entry to the left turn map from each incoming edge to the
  // immediately following outgoing edge in clockwise order.
  int out = 0, in = 0;
  const Edge* out_edge = &edge(out);
  const Edge* in_edge = &edge(in_edge_ids[in]);
  Edge sentinel(num_vertices(), num_vertices());
  Edge min_edge = min(*out_edge, reverse(*in_edge));
  while (min_edge != sentinel) {
    // Gather all incoming and outgoing edges around vertex "v0".
    VertexId v0 = min_edge.first;
    for (; min_edge.first == v0; min_edge = min(*out_edge, reverse(*in_edge))) {
      VertexId v1 = min_edge.second;
      // Count the number of copies of "min_edge" in each direction.
      int out_begin = out, in_begin = in;
      while (*out_edge == min_edge) {
        out_edge = (++out == num_edges()) ? &sentinel : &edge(out);
      }
      while (reverse(*in_edge) == min_edge) {
        in_edge = (++in == num_edges()) ? &sentinel : &edge(in_edge_ids[in]);
      }
      if (v0 != v1) {
        AddVertexEdges(out_begin, out, in_begin, in, v1, &v0_edges);
      } else {
        // Each degenerate edge becomes its own loop.
        for (; in_begin < in; ++in_begin) {
          (*left_turn_map)[in_begin] = in_begin;
        }
      }
    }
    if (v0_edges.empty()) continue;

    // Sort the edges in clockwise order around "v0".
    VertexId min_endpoint = v0_edges.front().endpoint;
    std::sort(v0_edges.begin() + 1, v0_edges.end(),
              [v0, min_endpoint, this](const VertexEdge& a,
                                       const VertexEdge& b) {
        if (a.endpoint == b.endpoint) return a.rank < b.rank;
        if (a.endpoint == min_endpoint) return true;
        if (b.endpoint == min_endpoint) return false;
        return !s2pred::OrderedCCW(vertex(a.endpoint), vertex(b.endpoint),
                                   vertex(min_endpoint), vertex(v0));
      });
    // Match incoming with outgoing edges.  We do this by keeping a stack of
    // unmatched incoming edges.  We also keep a stack of outgoing edges with
    // no previous incoming edge, and match these at the end by wrapping
    // around circularly to the start of the edge ordering.
    for (const VertexEdge& e : v0_edges) {
      if (e.incoming) {
        e_in.push_back(in_edge_ids[e.index]);
      } else if (!e_in.empty()) {
        (*left_turn_map)[e_in.back()] = e.index;
        e_in.pop_back();
      } else {
        e_out.push_back(e.index);  // Matched below.
      }
    }
    // Pair up additional edges using the fact that the ordering is circular.
    std::reverse(e_out.begin(), e_out.end());
    for (; !e_out.empty() && !e_in.empty(); e_out.pop_back(), e_in.pop_back()) {
      (*left_turn_map)[e_in.back()] = e_out.back();
    }
    // We only need to process unmatched incoming edges, since we are only
    // responsible for creating left turn map entries for those edges.
    if (!e_in.empty() && error->ok()) {
      error->Init(S2Error::BUILDER_EDGES_DO_NOT_FORM_LOOPS,
                  "Given edges do not form loops (indegree != outdegree)");
    }
    e_in.clear();
    e_out.clear();
    v0_edges.clear();
  }
  return error->ok();
}